

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPExternalTransmitter::NewDataAvailable(RTPExternalTransmitter *this)

{
  bool local_19;
  bool v;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->created & 1U) == 0) {
      local_19 = false;
    }
    else {
      local_19 = std::__cxx11::
                 list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::empty
                           (&this->rawpacketlist);
      local_19 = !local_19;
    }
    this_local._7_1_ = local_19;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPExternalTransmitter::NewDataAvailable()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
	{
		if (rawpacketlist.empty())
			v = false;
		else
			v = true;
	}
	
	MAINMUTEX_UNLOCK
	return v;
}